

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall r_comp::Preprocessor::Preprocessor(Preprocessor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  RepliStruct *pRVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_39;
  RepliStruct *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  Type local_1c;
  
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_templateClasses)._M_h._M_buckets = &(this->m_templateClasses)._M_h._M_single_bucket;
  (this->m_templateClasses)._M_h._M_bucket_count = 1;
  (this->m_templateClasses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_templateClasses)._M_h._M_element_count = 0;
  (this->m_templateClasses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_templateClasses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_templateClasses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1c = Root;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
            (a_Stack_30,&local_38,(allocator<r_comp::RepliStruct> *)&local_39,&local_1c);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  pRVar1 = local_38;
  local_38 = (RepliStruct *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar1;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  return;
}

Assistant:

Preprocessor::Preprocessor()
{
    root = std::make_shared<RepliStruct>(RepliStruct::Root);
}